

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importsource.cpp
# Opt level: O2

bool __thiscall libcellml::ImportSource::doEquals(ImportSource *this,EntityPtr *other)

{
  EntityImpl *pEVar1;
  bool bVar2;
  byte unaff_BPL;
  shared_ptr<libcellml::ImportSource> importSource;
  shared_ptr<libcellml::Entity> local_50;
  string local_40;
  
  bVar2 = Entity::doEquals(&this->super_Entity,other);
  if (bVar2) {
    std::dynamic_pointer_cast<libcellml::ImportSource,libcellml::Entity>(&local_50);
    if ((ImportSource *)
        local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (ImportSource *)0x0) {
      pEVar1 = (this->super_Entity).mPimpl;
      url_abi_cxx11_(&local_40,
                     (ImportSource *)
                     local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
      unaff_BPL = std::operator==(&pEVar1[1].mId,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((ImportSource *)
        local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (ImportSource *)0x0) goto LAB_001f3e85;
  }
  unaff_BPL = 0;
LAB_001f3e85:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ImportSource::doEquals(const EntityPtr &other) const
{
    if (Entity::doEquals(other)) {
        auto importSource = std::dynamic_pointer_cast<ImportSource>(other);
        if (importSource != nullptr) {
            return pFunc()->mUrl == importSource->url();
        }
    }
    return false;
}